

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

bool __thiscall filesystem::path::is_directory(path *this)

{
  int iVar1;
  char *__file;
  stat sb;
  path_type in_stack_00000104;
  path *in_stack_00000108;
  string local_c0 [32];
  stat local_a0;
  bool local_1;
  
  str_abi_cxx11_(in_stack_00000108,in_stack_00000104);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,&local_a0);
  std::__cxx11::string::~string(local_c0);
  local_1 = iVar1 == 0 && (local_a0.st_mode & 0xf000) == 0x4000;
  return local_1;
}

Assistant:

bool is_directory() const {
#if defined(_WIN32)
        DWORD result = GetFileAttributesW(wstr().c_str());
        if (result == INVALID_FILE_ATTRIBUTES)
            return false;
        return (result & FILE_ATTRIBUTE_DIRECTORY) != 0;
#else
        struct stat sb;
        if (stat(str().c_str(), &sb))
            return false;
        return S_ISDIR(sb.st_mode);
#endif
    }